

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# l2_eval.c
# Opt level: O2

l2_expr_info *
l2_eval_expr_eq_ne1(l2_expr_info *__return_storage_ptr__,l2_scope *scope_p,
                   l2_expr_info left_expr_info)

{
  double dVar1;
  l2_expr_info left_expr_info_00;
  boolean bVar2;
  l2_token *plVar3;
  char *pcVar4;
  int cols;
  int lines;
  char *pcVar5;
  char *pcVar6;
  bool bVar7;
  double dVar8;
  l2_expr_info local_40;
  
  bVar2 = l2_parse_probe_next_token_by_type(L2_TOKEN_EQUAL);
  dVar1 = left_expr_info.val._0_8_;
  if (bVar2 == '\0') {
    bVar2 = l2_parse_probe_next_token_by_type(L2_TOKEN_NOT_EQUAL);
    if (bVar2 == '\0') {
      (__return_storage_ptr__->val).procedure.upper_scope_p =
           left_expr_info.val.procedure.upper_scope_p;
      *(long *)__return_storage_ptr__ = left_expr_info._0_8_;
      (__return_storage_ptr__->val).real = dVar1;
      return __return_storage_ptr__;
    }
    l2_parse_token_forward();
    plVar3 = l2_parse_token_current();
    l2_eval_expr_gt_lt_ge_le(&local_40,scope_p);
    dVar8 = (double)CONCAT71(local_40.val.integer._1_7_,local_40.val.bool);
    if (left_expr_info.val_type == L2_EXPR_VAL_TYPE_BOOL) {
      if (local_40.val_type != L2_EXPR_VAL_TYPE_BOOL) {
        if (local_40.val_type == L2_EXPR_VAL_TYPE_REAL) {
          lines = plVar3->current_line;
          cols = plVar3->current_col;
          pcVar4 = "!=";
          goto LAB_0010827e;
        }
        if (local_40.val_type != L2_EXPR_VAL_TYPE_INTEGER) goto LAB_0010825d;
        lines = plVar3->current_line;
        cols = plVar3->current_col;
        pcVar4 = "!=";
        goto LAB_001081cc;
      }
      bVar7 = left_expr_info.val.bool == local_40.val.bool;
    }
    else {
      if (left_expr_info.val_type == L2_EXPR_VAL_TYPE_REAL) {
        if (local_40.val_type == L2_EXPR_VAL_TYPE_INTEGER) {
          dVar8 = (double)(long)dVar8;
        }
        else if (local_40.val_type != L2_EXPR_VAL_TYPE_REAL) {
          if (local_40.val_type != L2_EXPR_VAL_TYPE_BOOL) goto LAB_0010825d;
          lines = plVar3->current_line;
          cols = plVar3->current_col;
          pcVar4 = "!=";
          goto LAB_00108230;
        }
        bVar7 = dVar8 != dVar1;
        goto LAB_0010814d;
      }
      if (left_expr_info.val_type != L2_EXPR_VAL_TYPE_INTEGER) goto LAB_0010825d;
      if (local_40.val_type != L2_EXPR_VAL_TYPE_INTEGER) {
        if (local_40.val_type == L2_EXPR_VAL_TYPE_REAL) {
          bVar7 = dVar8 != (double)(long)dVar1;
          goto LAB_0010814d;
        }
        if (local_40.val_type != L2_EXPR_VAL_TYPE_BOOL) goto LAB_0010825d;
        lines = plVar3->current_line;
        cols = plVar3->current_col;
        pcVar4 = "!=";
LAB_0010824d:
        pcVar5 = "integer";
        goto LAB_00108254;
      }
      bVar7 = dVar1 == dVar8;
    }
    local_40.val.bool = !bVar7;
  }
  else {
    l2_parse_token_forward();
    plVar3 = l2_parse_token_current();
    l2_eval_expr_gt_lt_ge_le(&local_40,scope_p);
    dVar8 = (double)CONCAT71(local_40.val.integer._1_7_,local_40.val.bool);
    if (left_expr_info.val_type == L2_EXPR_VAL_TYPE_BOOL) {
      if (local_40.val_type == L2_EXPR_VAL_TYPE_BOOL) {
        local_40.val.bool = left_expr_info.val.bool == local_40.val.bool;
        goto LAB_00108159;
      }
      if (local_40.val_type == L2_EXPR_VAL_TYPE_REAL) {
        lines = plVar3->current_line;
        cols = plVar3->current_col;
        pcVar4 = "==";
LAB_0010827e:
        pcVar5 = "bool";
        pcVar6 = "real";
        goto LAB_0010828c;
      }
      if (local_40.val_type != L2_EXPR_VAL_TYPE_INTEGER) goto LAB_0010825d;
      lines = plVar3->current_line;
      cols = plVar3->current_col;
      pcVar4 = "==";
LAB_001081cc:
      pcVar5 = "bool";
      pcVar6 = "integer";
LAB_0010828c:
      local_40.val_type = L2_EXPR_VAL_TYPE_BOOL;
      l2_parsing_error(L2_PARSING_ERROR_DUALISTIC_OPERATOR_CONTAINS_INCOMPATIBLE_TYPE,lines,cols,
                       pcVar4,pcVar5,pcVar6);
    }
    if (left_expr_info.val_type == L2_EXPR_VAL_TYPE_REAL) {
      if (local_40.val_type == L2_EXPR_VAL_TYPE_INTEGER) {
        dVar8 = (double)(long)dVar8;
      }
      else if (local_40.val_type != L2_EXPR_VAL_TYPE_REAL) {
        if (local_40.val_type != L2_EXPR_VAL_TYPE_BOOL) goto LAB_0010825d;
        lines = plVar3->current_line;
        cols = plVar3->current_col;
        pcVar4 = "==";
LAB_00108230:
        pcVar5 = "real";
LAB_00108254:
        pcVar6 = "bool";
        goto LAB_0010828c;
      }
      bVar7 = dVar8 == dVar1;
    }
    else {
      if (left_expr_info.val_type != L2_EXPR_VAL_TYPE_INTEGER) {
LAB_0010825d:
        local_40.val_type = L2_EXPR_VAL_TYPE_BOOL;
        l2_parsing_error(L2_PARSING_ERROR_INCOMPATIBLE_EXPR_TYPE,plVar3->current_line,
                         plVar3->current_col);
      }
      if (local_40.val_type == L2_EXPR_VAL_TYPE_INTEGER) {
        local_40.val.bool = dVar1 == dVar8;
        goto LAB_00108159;
      }
      if (local_40.val_type != L2_EXPR_VAL_TYPE_REAL) {
        if (local_40.val_type != L2_EXPR_VAL_TYPE_BOOL) goto LAB_0010825d;
        lines = plVar3->current_line;
        cols = plVar3->current_col;
        pcVar4 = "==";
        goto LAB_0010824d;
      }
      bVar7 = dVar8 == (double)(long)dVar1;
    }
LAB_0010814d:
    local_40.val.bool = -bVar7 & 1;
  }
LAB_00108159:
  local_40.val_type = L2_EXPR_VAL_TYPE_BOOL;
  left_expr_info_00._4_4_ = local_40._4_4_;
  left_expr_info_00.val_type = 4;
  left_expr_info_00.val.integer._1_7_ = local_40.val.integer._1_7_;
  left_expr_info_00.val.bool = local_40.val.bool;
  left_expr_info_00.val.procedure.upper_scope_p = local_40.val.procedure.upper_scope_p;
  l2_eval_expr_eq_ne1(__return_storage_ptr__,scope_p,left_expr_info_00);
  return __return_storage_ptr__;
}

Assistant:

l2_expr_info l2_eval_expr_eq_ne1(l2_scope *scope_p, l2_expr_info left_expr_info) {
    l2_expr_info right_expr_info, new_left_expr_info;
    _declr_current_token_p
    _if_type (L2_TOKEN_EQUAL) /* == */
    {
        _get_current_token_p
        right_expr_info = l2_eval_expr_gt_lt_ge_le(scope_p);
        new_left_expr_info.val_type = L2_EXPR_VAL_TYPE_BOOL;
        switch (left_expr_info.val_type) {
            case L2_EXPR_VAL_TYPE_INTEGER:
                switch (right_expr_info.val_type) {
                    case L2_EXPR_VAL_TYPE_INTEGER:
                        new_left_expr_info.val.bool = (left_expr_info.val.integer == right_expr_info.val.integer);
                        break;

                    case L2_EXPR_VAL_TYPE_BOOL:
                        l2_parsing_error(L2_PARSING_ERROR_DUALISTIC_OPERATOR_CONTAINS_INCOMPATIBLE_TYPE, current_token_p->current_line, current_token_p->current_col, "==", "integer", "bool");

                    case L2_EXPR_VAL_TYPE_REAL:
                        new_left_expr_info.val.bool = ((double)left_expr_info.val.integer == right_expr_info.val.real);
                        break;

                    default:
                        l2_parsing_error(L2_PARSING_ERROR_INCOMPATIBLE_EXPR_TYPE, current_token_p->current_line, current_token_p->current_col);
                }
                break;

            case L2_EXPR_VAL_TYPE_BOOL:
                switch (right_expr_info.val_type) {
                    case L2_EXPR_VAL_TYPE_INTEGER:
                        l2_parsing_error(L2_PARSING_ERROR_DUALISTIC_OPERATOR_CONTAINS_INCOMPATIBLE_TYPE, current_token_p->current_line, current_token_p->current_col, "==", "bool", "integer");

                    case L2_EXPR_VAL_TYPE_BOOL:
                        new_left_expr_info.val.bool = (left_expr_info.val.bool == right_expr_info.val.bool);
                        break;

                    case L2_EXPR_VAL_TYPE_REAL:
                        l2_parsing_error(L2_PARSING_ERROR_DUALISTIC_OPERATOR_CONTAINS_INCOMPATIBLE_TYPE, current_token_p->current_line, current_token_p->current_col, "==", "bool", "real");

                    default:
                        l2_parsing_error(L2_PARSING_ERROR_INCOMPATIBLE_EXPR_TYPE, current_token_p->current_line, current_token_p->current_col);
                }
                break;

            case L2_EXPR_VAL_TYPE_REAL:
                switch (right_expr_info.val_type) {
                    case L2_EXPR_VAL_TYPE_INTEGER:
                        new_left_expr_info.val.bool = (left_expr_info.val.real == (double)right_expr_info.val.integer);
                        break;

                    case L2_EXPR_VAL_TYPE_BOOL:
                        l2_parsing_error(L2_PARSING_ERROR_DUALISTIC_OPERATOR_CONTAINS_INCOMPATIBLE_TYPE, current_token_p->current_line, current_token_p->current_col, "==", "real", "bool");

                    case L2_EXPR_VAL_TYPE_REAL:
                        new_left_expr_info.val.bool = (left_expr_info.val.real == right_expr_info.val.real);
                        break;

                    default:
                        l2_parsing_error(L2_PARSING_ERROR_INCOMPATIBLE_EXPR_TYPE, current_token_p->current_line, current_token_p->current_col);
                }
                break;

            default:
                l2_parsing_error(L2_PARSING_ERROR_INCOMPATIBLE_EXPR_TYPE, current_token_p->current_line, current_token_p->current_col);
        }
        return l2_eval_expr_eq_ne1(scope_p, new_left_expr_info);

    }
    _elif_type (L2_TOKEN_NOT_EQUAL) /* != */
    {
        _get_current_token_p
        right_expr_info = l2_eval_expr_gt_lt_ge_le(scope_p);
        new_left_expr_info.val_type = L2_EXPR_VAL_TYPE_BOOL;
        switch (left_expr_info.val_type) {
            case L2_EXPR_VAL_TYPE_INTEGER:
                switch (right_expr_info.val_type) {
                    case L2_EXPR_VAL_TYPE_INTEGER:
                        new_left_expr_info.val.bool = (left_expr_info.val.integer != right_expr_info.val.integer);
                        break;

                    case L2_EXPR_VAL_TYPE_BOOL:
                        l2_parsing_error(L2_PARSING_ERROR_DUALISTIC_OPERATOR_CONTAINS_INCOMPATIBLE_TYPE, current_token_p->current_line, current_token_p->current_col, "!=", "integer", "bool");

                    case L2_EXPR_VAL_TYPE_REAL:
                        new_left_expr_info.val.bool = ((double)left_expr_info.val.integer != right_expr_info.val.real);
                        break;

                    default:
                        l2_parsing_error(L2_PARSING_ERROR_INCOMPATIBLE_EXPR_TYPE, current_token_p->current_line, current_token_p->current_col);
                }
                break;

            case L2_EXPR_VAL_TYPE_BOOL:
                switch (right_expr_info.val_type) {
                    case L2_EXPR_VAL_TYPE_INTEGER:
                        l2_parsing_error(L2_PARSING_ERROR_DUALISTIC_OPERATOR_CONTAINS_INCOMPATIBLE_TYPE, current_token_p->current_line, current_token_p->current_col, "!=", "bool", "integer");

                    case L2_EXPR_VAL_TYPE_BOOL:
                        new_left_expr_info.val.bool = (left_expr_info.val.bool != right_expr_info.val.bool);
                        break;

                    case L2_EXPR_VAL_TYPE_REAL:
                        l2_parsing_error(L2_PARSING_ERROR_DUALISTIC_OPERATOR_CONTAINS_INCOMPATIBLE_TYPE, current_token_p->current_line, current_token_p->current_col, "!=", "bool", "real");

                    default:
                        l2_parsing_error(L2_PARSING_ERROR_INCOMPATIBLE_EXPR_TYPE, current_token_p->current_line, current_token_p->current_col);
                }
                break;

            case L2_EXPR_VAL_TYPE_REAL:
                switch (right_expr_info.val_type) {
                    case L2_EXPR_VAL_TYPE_INTEGER:
                        new_left_expr_info.val.bool = (left_expr_info.val.real != (double)right_expr_info.val.integer);
                        break;

                    case L2_EXPR_VAL_TYPE_BOOL:
                        l2_parsing_error(L2_PARSING_ERROR_DUALISTIC_OPERATOR_CONTAINS_INCOMPATIBLE_TYPE, current_token_p->current_line, current_token_p->current_col, "!=", "real", "bool");

                    case L2_EXPR_VAL_TYPE_REAL:
                        new_left_expr_info.val.bool = (left_expr_info.val.real != right_expr_info.val.real);
                        break;

                    default:
                        l2_parsing_error(L2_PARSING_ERROR_INCOMPATIBLE_EXPR_TYPE, current_token_p->current_line, current_token_p->current_col);
                }
                break;

            default:
                l2_parsing_error(L2_PARSING_ERROR_INCOMPATIBLE_EXPR_TYPE, current_token_p->current_line, current_token_p->current_col);
        }
        return l2_eval_expr_eq_ne1(scope_p, new_left_expr_info);

    }
    _else
    {
        return left_expr_info;
    }
}